

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilUtil.c
# Opt level: O1

int Extra_UtilGetopt(int argc,char **argv,char *optstring)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  uint __c;
  
  globalUtilOptarg = (char *)0x0;
  if ((pScanStr == (char *)0x0) || (pcVar3 = pScanStr, *pScanStr == '\0')) {
    if (globalUtilOptind == 0) {
      globalUtilOptind = 1;
    }
    if (argc <= globalUtilOptind) {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
    pcVar1 = argv[globalUtilOptind];
    if (*pcVar1 != '-') {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
    if (pcVar1[1] == '\0') {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
    pcVar3 = pcVar1 + 1;
    globalUtilOptind = globalUtilOptind + 1;
    if ((*pcVar3 == '-') && (pcVar1[2] == '\0')) {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
  }
  pScanStr = pcVar3;
  pcVar3 = pScanStr + 1;
  __c = (uint)*pScanStr;
  pScanStr = pcVar3;
  pcVar1 = strchr(optstring,__c);
  if ((__c == 0x3a) || (pcVar1 == (char *)0x0)) {
    pcVar3 = *argv;
    pcVar1 = "%s: unknown option %c\n";
  }
  else {
    if (pcVar1[1] != ':') {
      return __c;
    }
    if (*pcVar3 != '\0') {
      globalUtilOptarg = pcVar3;
      pScanStr = (char *)0x0;
      return __c;
    }
    lVar2 = (long)globalUtilOptind;
    if (globalUtilOptind < argc) {
      globalUtilOptind = globalUtilOptind + 1;
      globalUtilOptarg = argv[lVar2];
      return __c;
    }
    pcVar3 = *argv;
    pcVar1 = "%s: %c requires an argument\n";
  }
  fprintf(_stderr,pcVar1,pcVar3,(ulong)__c);
  return 0x3f;
}

Assistant:

int Extra_UtilGetopt( int argc, char *argv[], const char *optstring )
{
    register int c;
    register const char *place;

    globalUtilOptarg = NULL;

    if (pScanStr == NULL || *pScanStr == '\0') 
    {
        if (globalUtilOptind == 0) 
            globalUtilOptind++;
        if (globalUtilOptind >= argc) 
            return EOF;
        place = argv[globalUtilOptind];
        if (place[0] != '-' || place[1] == '\0') 
            return EOF;
        globalUtilOptind++;
        if (place[1] == '-' && place[2] == '\0') 
            return EOF;
        pScanStr = place+1;
    }

    c = *pScanStr++;
    place = strchr(optstring, c);
    if (place == NULL || c == ':') {
        (void) fprintf(stderr, "%s: unknown option %c\n", argv[0], c);
        return '?';
    }
    if (*++place == ':') 
    {
        if (*pScanStr != '\0') 
        {
            globalUtilOptarg = pScanStr;
            pScanStr = NULL;
        } 
        else 
        {
            if (globalUtilOptind >= argc) 
            {
                (void) fprintf(stderr, "%s: %c requires an argument\n", 
                    argv[0], c);
                return '?';
            }
            globalUtilOptarg = argv[globalUtilOptind];
            globalUtilOptind++;
        }
    }
    return c;
}